

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode header_append(Curl_easy *data,SingleRequest *k,size_t length)

{
  char *pcVar1;
  char *pcVar2;
  CURLcode CVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  
  uVar4 = k->hbuflen + length;
  uVar6 = (data->state).headersize;
  if (uVar4 < uVar6) {
LAB_00112bd4:
    memcpy(k->hbufp,k->str_start,length);
    pcVar1 = k->hbufp;
    k->hbufp = pcVar1 + length;
    k->hbuflen = k->hbuflen + length;
    pcVar1[length] = '\0';
    CVar3 = CURLE_OK;
  }
  else {
    if (uVar4 < 0x19001) {
      uVar4 = (uVar4 >> 1) + uVar4;
      uVar6 = uVar6 * 2;
      if (uVar6 < uVar4) {
        uVar6 = uVar4;
      }
      pcVar1 = k->hbufp;
      pcVar2 = (data->state).headerbuff;
      pcVar5 = (char *)(*Curl_crealloc)(pcVar2,uVar6);
      if (pcVar5 != (char *)0x0) {
        (data->state).headersize = uVar6;
        (data->state).headerbuff = pcVar5;
        k->hbufp = pcVar5 + ((long)pcVar1 - (long)pcVar2);
        goto LAB_00112bd4;
      }
      Curl_failf(data,"Failed to alloc memory for big header!");
    }
    else {
      Curl_failf(data,"Avoided giant realloc for header (max is %d)!",0x19000);
    }
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  return CVar3;
}

Assistant:

static CURLcode header_append(struct Curl_easy *data,
                              struct SingleRequest *k,
                              size_t length)
{
  if(k->hbuflen + length >= data->state.headersize) {
    /* We enlarge the header buffer as it is too small */
    char *newbuff;
    size_t hbufp_index;
    size_t newsize;

    if(k->hbuflen + length > CURL_MAX_HTTP_HEADER) {
      /* The reason to have a max limit for this is to avoid the risk of a bad
         server feeding libcurl with a never-ending header that will cause
         reallocs infinitely */
      failf(data, "Avoided giant realloc for header (max is %d)!",
            CURL_MAX_HTTP_HEADER);
      return CURLE_OUT_OF_MEMORY;
    }

    newsize=CURLMAX((k->hbuflen+ length)*3/2, data->state.headersize*2);
    hbufp_index = k->hbufp - data->state.headerbuff;
    newbuff = realloc(data->state.headerbuff, newsize);
    if(!newbuff) {
      failf(data, "Failed to alloc memory for big header!");
      return CURLE_OUT_OF_MEMORY;
    }
    data->state.headersize=newsize;
    data->state.headerbuff = newbuff;
    k->hbufp = data->state.headerbuff + hbufp_index;
  }
  memcpy(k->hbufp, k->str_start, length);
  k->hbufp += length;
  k->hbuflen += length;
  *k->hbufp = 0;

  return CURLE_OK;
}